

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

int sexp_reset_weak_references(sexp_conflict ctx)

{
  short sVar1;
  sexp_heap_conflict psVar2;
  char *pcVar3;
  sexp_uint_t sVar4;
  sexp_conflict psVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  sexp_uint_t sVar12;
  ulong uVar13;
  sexp_conflict psVar14;
  uint uVar15;
  ulong uVar16;
  sexp_heap_conflict *ppsVar17;
  sexp_conflict x;
  
  if ((((ctx->value).type.setters)->value).context.mark_stack[7].start == (sexp_conflict *)0x3e) {
    return 0;
  }
  ppsVar17 = &(ctx->value).context.heap;
  iVar10 = 0;
  do {
    psVar2 = *ppsVar17;
    if (psVar2 == (sexp_heap_conflict)0x0) {
      return iVar10;
    }
    psVar14 = (sexp_conflict)psVar2->free_list;
    pcVar3 = psVar2->data;
    x = (sexp_conflict)(pcVar3 + 0x20);
    sVar4 = psVar2->size;
    while (psVar5 = psVar14, x < (sexp_conflict)(pcVar3 + sVar4)) {
      do {
        psVar14 = psVar5;
        psVar5 = (psVar14->value).type.name;
        if (psVar5 == (sexp_conflict)0x0) break;
      } while (psVar5 < x);
      if (psVar5 == x) {
        x = (sexp_conflict)((long)&x->tag + *(long *)psVar5);
      }
      else {
        if (x->markedp != '\0') {
          lVar6 = *(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                           (ulong)x->tag * 8 + 8);
          lVar11 = (long)*(short *)(lVar6 + 100);
          if (0 < lVar11) {
            uVar15 = (int)*(short *)(lVar6 + 0x66) +
                     (int)*(short *)(lVar6 + 0x6a) *
                     (int)*(undefined8 *)((long)&x->tag + (long)*(short *)(lVar6 + 0x68));
            uVar13 = 0;
            if (0 < (int)uVar15) {
              uVar13 = (ulong)uVar15;
            }
            bVar8 = true;
            for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
              uVar7 = *(ulong *)((long)&x->tag + uVar16 * 8 + lVar11);
              bVar9 = false;
              if (((uVar7 & 3) == 0 && uVar7 != 0) && (*(char *)(uVar7 + 4) == '\0')) {
                *(undefined8 *)((long)&x->tag + uVar16 * 8 + lVar11) = 0x3e;
                x->field_0x5 = x->field_0x5 | 4;
                bVar9 = bVar8;
              }
              bVar8 = bVar9;
            }
            if (bVar8) {
              sVar1 = *(short *)(lVar6 + 0x6c);
              for (; (long)uVar13 < (long)(int)(uVar15 + (int)sVar1); uVar13 = uVar13 + 1) {
                *(undefined8 *)((long)&x->tag + uVar13 * 8 + lVar11) = 0x3e;
              }
              iVar10 = iVar10 + 1;
            }
          }
        }
        sVar12 = sexp_allocated_bytes(ctx,x);
        x = (sexp_conflict)((long)&x->tag + (sVar12 + 0x1f & 0xffffffffffffffe0));
      }
    }
    ppsVar17 = &psVar2->next;
  } while( true );
}

Assistant:

int sexp_reset_weak_references(sexp ctx) {
  int i, len, broke, all_reset_p;
  sexp_heap h;
  sexp p, t, end, *v;
  sexp_free_list q, r;
  if (sexp_not(sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT)))
    return 0;
  broke = 0;
  /* just scan the whole heap */
  for (h = sexp_context_heap(ctx) ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      if (sexp_valid_object_p(ctx, p) && sexp_markedp(p)) {
        t = sexp_object_type(ctx, p);
        if (sexp_type_weak_base(t) > 0) {
          all_reset_p = 1;
          v = (sexp*) ((char*)p + sexp_type_weak_base(t));
          len = sexp_type_num_weak_slots_of_object(t, p);
          for (i=0; i<len; i++) {
            if (v[i] && sexp_pointerp(v[i]) && ! sexp_markedp(v[i])) {
              v[i] = SEXP_FALSE;
              sexp_brokenp(p) = 1;
            } else {
              all_reset_p = 0;
            }
          }
          if (all_reset_p) {      /* ephemerons */
            broke++;
            len += sexp_type_weak_len_extra(t);
            for ( ; i<len; i++) v[i] = SEXP_FALSE;
          }
        }
      }
      p = (sexp) (((char*)p)+sexp_heap_align(sexp_allocated_bytes(ctx, p)));
    }
  }
  sexp_debug_printf("%p (broke %d weak references)", ctx, broke);
  return broke;
}